

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O1

void __thiscall
glslang::TPpContext::TokenizableIncludeFile::TokenizableIncludeFile
          (TokenizableIncludeFile *this,TSourceLoc *startLoc,string *prologue,
          IncludeResult *includedFile,string *epilogue,TPpContext *pp)

{
  TInputScanner *this_00;
  int iVar1;
  pointer pcVar2;
  size_type sVar3;
  IncludeResult *pIVar4;
  TSourceLoc *pTVar5;
  int iVar6;
  int iVar7;
  pointer pcVar8;
  pointer filename;
  
  (this->super_tInput).done = false;
  (this->super_tInput).pp = pp;
  (this->super_tInput)._vptr_tInput = (_func_int **)&PTR__TokenizableIncludeFile_00944e98;
  (this->prologue_)._M_dataplus._M_p = (pointer)&(this->prologue_).field_2;
  pcVar2 = (prologue->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->prologue_,pcVar2,pcVar2 + prologue->_M_string_length);
  (this->epilogue_)._M_dataplus._M_p = (pointer)&(this->epilogue_).field_2;
  pcVar2 = (epilogue->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->epilogue_,pcVar2,pcVar2 + epilogue->_M_string_length);
  this->includedFile_ = includedFile;
  this_00 = &this->scanner;
  TInputScanner::TInputScanner(this_00,3,this->strings,this->lengths,(char **)0x0,0,0,true);
  this->prevScanner = (TInputScanner *)0x0;
  (this->stringInput).super_tInput.done = false;
  (this->stringInput).super_tInput.pp = pp;
  (this->stringInput).super_tInput._vptr_tInput = (_func_int **)&PTR__tInput_0093beb0;
  (this->stringInput).input = this_00;
  sVar3 = (this->prologue_)._M_string_length;
  this->strings[0] = (this->prologue_)._M_dataplus._M_p;
  pIVar4 = this->includedFile_;
  this->strings[1] = pIVar4->headerData;
  this->strings[2] = (this->epilogue_)._M_dataplus._M_p;
  this->lengths[0] = sVar3;
  this->lengths[1] = pIVar4->headerLength;
  this->lengths[2] = (this->epilogue_)._M_string_length;
  iVar1 = startLoc->line;
  (this->scanner).logicalSourceLoc.line = iVar1;
  pTVar5 = (this->scanner).loc;
  iVar7 = (this->scanner).currentSource;
  iVar6 = (this->scanner).numSources + -1;
  if (iVar6 < iVar7) {
    iVar7 = iVar6;
  }
  pTVar5[iVar7].line = iVar1;
  iVar1 = startLoc->string;
  (this->scanner).logicalSourceLoc.string = iVar1;
  iVar7 = (this->scanner).currentSource;
  if (iVar6 < iVar7) {
    iVar7 = iVar6;
  }
  pTVar5[iVar7].string = iVar1;
  (this->scanner).logicalSourceLoc.name = (TString *)0x0;
  iVar1 = (this->scanner).currentSource;
  if (iVar1 <= iVar6) {
    iVar6 = iVar1;
  }
  pTVar5[iVar6].name = (TString *)0x0;
  filename = "";
  pcVar8 = "";
  if (startLoc->name != (TString *)0x0) {
    pcVar8 = (startLoc->name->_M_dataplus)._M_p;
  }
  TInputScanner::setFile(this_00,pcVar8,0);
  pcVar8 = "";
  if (startLoc->name != (TString *)0x0) {
    pcVar8 = (startLoc->name->_M_dataplus)._M_p;
  }
  TInputScanner::setFile(this_00,pcVar8,1);
  if (startLoc->name != (TString *)0x0) {
    filename = (startLoc->name->_M_dataplus)._M_p;
  }
  TInputScanner::setFile(this_00,filename,2);
  return;
}

Assistant:

TokenizableIncludeFile(const TSourceLoc& startLoc,
                          const std::string& prologue,
                          TShader::Includer::IncludeResult* includedFile,
                          const std::string& epilogue,
                          TPpContext* pp)
            : tInput(pp),
              prologue_(prologue),
              epilogue_(epilogue),
              includedFile_(includedFile),
              scanner(3, strings, lengths, nullptr, 0, 0, true),
              prevScanner(nullptr),
              stringInput(pp, scanner)
        {
              strings[0] = prologue_.data();
              strings[1] = includedFile_->headerData;
              strings[2] = epilogue_.data();

              lengths[0] = prologue_.size();
              lengths[1] = includedFile_->headerLength;
              lengths[2] = epilogue_.size();

              scanner.setLine(startLoc.line);
              scanner.setString(startLoc.string);

              scanner.setFile(startLoc.getFilenameStr(), 0);
              scanner.setFile(startLoc.getFilenameStr(), 1);
              scanner.setFile(startLoc.getFilenameStr(), 2);
        }